

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O2

double __thiscall Activation::run(Activation *this,double input)

{
  Func_Param *pFVar1;
  Func_Param *param;
  Func_Param *param_00;
  double dVar2;
  double dVar3;
  
  pFVar1 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (param_00 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>.
                  _M_impl.super__Vector_impl_data._M_start; param_00 != pFVar1;
      param_00 = param_00 + 1) {
    dVar2 = gate(param_00,input);
    dVar3 = dVar3 + dVar2;
  }
  return dVar3;
}

Assistant:

double Activation::run(double input) const{
    double result=0.;
    for(const auto& param: m_params)
        result+=Activation::gate(param, input);
    return result;
}